

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O2

bool __thiscall Satyricon::SATSolver::simplify_clause(SATSolver *this,ClausePtr c)

{
  uint uVar1;
  literal_value lVar2;
  pointer plVar3;
  long lVar4;
  size_t new_size;
  literal_value lVar5;
  long lVar6;
  
  plVar3 = (this->values).
           super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (ulong)(*(uint *)c & 0xfffffffe) * 2;
  new_size = 0;
  for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 4) {
    uVar1 = *(uint *)(&c[1].field_0x0 + lVar6);
    lVar2 = plVar3[uVar1 >> 1];
    lVar5 = LIT_TRUE - lVar2;
    if ((uVar1 & 1) == 0) {
      lVar5 = lVar2;
    }
    if (lVar5 == LIT_UNASIGNED) {
      *(uint *)(&c[1].field_0x0 + new_size * 4) = uVar1;
      new_size = new_size + 1;
    }
    else if (lVar5 == LIT_TRUE) goto LAB_00113ca0;
  }
  Clause::shrink(c,new_size);
LAB_00113ca0:
  return lVar4 != lVar6;
}

Assistant:

bool SATSolver::simplify_clause( ClausePtr c ) {
    size_t j = 0;
    for ( const auto & l : *c ) {
        if ( get_asigned_value(l) == LIT_TRUE )
            return true; // useless
        if ( get_asigned_value(l) == LIT_UNASIGNED )
            c->at(j++) = l;
    }
    c->shrink(j);
    return false; // still usefull
}